

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

any * Omega_h::anon_unknown_41::eval_or(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  int *piVar1;
  char *pcVar2;
  ulong *puVar3;
  Alloc *pAVar4;
  bool bVar5;
  int iVar6;
  type_info *ptVar7;
  undefined7 extraout_var;
  any *paVar8;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined7 uVar10;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  any *extraout_RAX_00;
  undefined8 *puVar9;
  ParserFail *this;
  Bytes local_60;
  Bytes local_50;
  undefined1 local_40 [32];
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar7 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar7 = (*lhs->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar7 + 8);
  if (pcVar2 == _ofstream) {
LAB_002a28f3:
    bVar5 = any::is_typed(lhs,(type_info *)&bool::typeinfo);
    if (!bVar5) goto LAB_002a2b00;
    paVar8 = (any *)CONCAT71(extraout_var,1);
    if (*(char *)&lhs->storage == '\0') {
      bVar5 = any::is_typed(rhs,(type_info *)&bool::typeinfo);
      if (!bVar5) goto LAB_002a2b00;
      paVar8 = (any *)CONCAT71(extraout_var_00,*(undefined1 *)&rhs->storage);
    }
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<bool>()::table;
    *(char *)&__return_storage_ptr__->storage = (char)paVar8;
  }
  else {
    if (*pcVar2 != '*') {
      iVar6 = strcmp(pcVar2,_ofstream);
      if (iVar6 == 0) goto LAB_002a28f3;
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar7 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar7 = (*lhs->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar7 + 8);
    if (pcVar2 != "N7Omega_h4ReadIaEE") {
      if (*pcVar2 == '*') {
LAB_002a2b5c:
        this = (ParserFail *)__cxa_allocate_exception(0x10);
        local_40._0_8_ = local_40 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,"Invalid operand types to || operator","");
        ParserFail::ParserFail(this,(string *)local_40);
        __cxa_throw(this,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      iVar6 = strcmp(pcVar2,"N7Omega_h4ReadIaEE");
      if (iVar6 != 0) goto LAB_002a2b5c;
    }
    bVar5 = any::is_typed(lhs,(type_info *)&Read<signed_char>::typeinfo);
    if ((!bVar5) || (puVar3 = (ulong *)(lhs->storage).dynamic, puVar3 == (ulong *)0x0)) {
LAB_002a2b00:
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar9,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    local_60.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.write_.shared_alloc_.alloc)->use_count =
             (local_60.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
    bVar5 = any::is_typed(rhs,(type_info *)&Read<signed_char>::typeinfo);
    if ((!bVar5) || (puVar3 = (ulong *)(rhs->storage).dynamic, puVar3 == (ulong *)0x0)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar9,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    local_50.write_.shared_alloc_.alloc = (Alloc *)*puVar3;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.write_.shared_alloc_.alloc =
             (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_50.write_.shared_alloc_.alloc)->use_count =
             (local_50.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.write_.shared_alloc_.direct_ptr = (void *)puVar3[1];
    lor_each((Omega_h *)local_40,&local_60,&local_50);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<Omega_h::Read<signed_char>>()::table;
    any::do_construct<Omega_h::Read<signed_char>,Omega_h::Read<signed_char>>
              (__return_storage_ptr__,(Read<signed_char> *)local_40);
    uVar10 = (undefined7)((ulong)extraout_RAX >> 8);
    if ((local_40._0_8_ & 7) == 0 && (Alloc *)local_40._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_40._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_40._0_8_);
        operator_delete((void *)local_40._0_8_,0x48);
        uVar10 = extraout_var_01;
      }
    }
    pAVar4 = local_50.write_.shared_alloc_.alloc;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        uVar10 = extraout_var_02;
      }
    }
    pAVar4 = local_60.write_.shared_alloc_.alloc;
    paVar8 = (any *)CONCAT71(uVar10,local_60.write_.shared_alloc_.alloc == (Alloc *)0x0);
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        paVar8 = extraout_RAX_00;
      }
    }
  }
  return paVar8;
}

Assistant:

any eval_or(any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool)) {
    return any_cast<bool>(lhs) || any_cast<bool>(rhs);
  } else if (lhs.type() == typeid(Bytes)) {
    return lor_each(any_cast<Bytes>(lhs), any_cast<Bytes>(rhs));
  } else {
    throw ParserFail("Invalid operand types to || operator");
  }
}